

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::LdExp::doApply
          (Interval *__return_storage_ptr__,LdExp *this,EvalContext *ctx,IArgs *iargs)

{
  Interval ret;
  IArg2 local_52;
  IArg3 local_51;
  Interval local_50;
  IRet local_38;
  
  call<deqp::gls::BuiltinPrecisionTests::Functions::Exp2>
            (&local_38,ctx,iargs->b,(IArg1 *)&local_50,&local_52,&local_51);
  if ((!NAN(local_38.m_hi) && local_38.m_lo == -INFINITY) ||
     (local_38.m_hi == INFINITY && !NAN(local_38.m_lo))) {
    local_50.m_hasNaN = true;
    local_50.m_lo = INFINITY;
    local_50.m_hi = -INFINITY;
    tcu::Interval::operator|=(&local_38,&local_50);
  }
  call<deqp::gls::BuiltinPrecisionTests::Functions::Mul>
            (__return_storage_ptr__,ctx,iargs->a,&local_38,(IArg2 *)&local_50,&local_52);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply			(const EvalContext& ctx, const IArgs& iargs) const
	{
		Interval	ret = call<Exp2>(ctx, iargs.b);
		// Khronos bug 11180 consensus: if exp2(exponent) cannot be represented,
		// the result is undefined.

		if (ret.contains(TCU_INFINITY) | ret.contains(-TCU_INFINITY))
			ret |= TCU_NAN;

		return call<Mul>(ctx, iargs.a, ret);
	}